

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O2

void __thiscall sf::Shape::update(Shape *this)

{
  VertexArray *this_00;
  float fVar1;
  float fVar2;
  Color CVar3;
  int iVar4;
  undefined4 extraout_var;
  Vertex *pVVar6;
  Vertex *pVVar7;
  ulong index;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  FloatRect FVar8;
  ulong uVar5;
  
  iVar4 = (*(this->super_Drawable)._vptr_Drawable[3])();
  uVar5 = CONCAT44(extraout_var,iVar4);
  this_00 = &this->m_vertices;
  if (uVar5 < 3) {
    VertexArray::resize(this_00,0);
    VertexArray::resize(&this->m_outlineVertices,0);
    return;
  }
  VertexArray::resize(this_00,uVar5 + 2);
  index = 0;
  while (uVar5 != index) {
    (*(this->super_Drawable)._vptr_Drawable[4])(this,index);
    index = index + 1;
    pVVar6 = VertexArray::operator[](this_00,index);
    (pVVar6->position).x = extraout_XMM0_Da;
    (pVVar6->position).y = extraout_XMM0_Db;
  }
  pVVar6 = VertexArray::operator[](this_00,1);
  pVVar7 = VertexArray::operator[](this_00,uVar5 + 1);
  pVVar7->position = pVVar6->position;
  pVVar6 = VertexArray::operator[](this_00,1);
  pVVar7 = VertexArray::operator[](this_00,0);
  CVar3 = pVVar6->color;
  fVar1 = (pVVar6->texCoords).x;
  pVVar7->position = pVVar6->position;
  pVVar7->color = CVar3;
  (pVVar7->texCoords).x = fVar1;
  (pVVar7->texCoords).y = (pVVar6->texCoords).y;
  FVar8 = VertexArray::getBounds(this_00);
  this->m_insideBounds = FVar8;
  pVVar6 = VertexArray::operator[](this_00,0);
  (pVVar6->position).x = FVar8.width * 0.5 + FVar8.left;
  fVar1 = (this->m_insideBounds).height;
  fVar2 = (this->m_insideBounds).top;
  pVVar6 = VertexArray::operator[](this_00,0);
  (pVVar6->position).y = fVar1 * 0.5 + fVar2;
  updateFillColors(this);
  updateTexCoords(this);
  updateOutline(this);
  return;
}

Assistant:

void Shape::update()
{
    // Get the total number of points of the shape
    std::size_t count = getPointCount();
    if (count < 3)
    {
        m_vertices.resize(0);
        m_outlineVertices.resize(0);
        return;
    }

    m_vertices.resize(count + 2); // + 2 for center and repeated first point

    // Position
    for (std::size_t i = 0; i < count; ++i)
        m_vertices[i + 1].position = getPoint(i);
    m_vertices[count + 1].position = m_vertices[1].position;

    // Update the bounding rectangle
    m_vertices[0] = m_vertices[1]; // so that the result of getBounds() is correct
    m_insideBounds = m_vertices.getBounds();

    // Compute the center and make it the first vertex
    m_vertices[0].position.x = m_insideBounds.left + m_insideBounds.width / 2;
    m_vertices[0].position.y = m_insideBounds.top + m_insideBounds.height / 2;

    // Color
    updateFillColors();

    // Texture coordinates
    updateTexCoords();

    // Outline
    updateOutline();
}